

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

ostream * cppnet::operator<<(ostream *out,Address *addr)

{
  string str;
  string local_30;
  
  Address::AsString_abi_cxx11_(&local_30,addr);
  std::ostream::write((char *)out,(long)local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return out;
}

Assistant:

std::ostream& operator<< (std::ostream &out, Address &addr) {
    const std::string str = addr.AsString();
    out.write(str.c_str(), str.length());
    return out;
}